

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QString>_>::erase
          (QMovableArrayOps<std::pair<QString,_QString>_> *this,pair<QString,_QString> *b,
          qsizetype n)

{
  pair<QString,_QString> *ppVar1;
  long lVar2;
  pair<QString,_QString> *ppVar3;
  pair<QString,_QString> *__last;
  
  __last = b + n;
  std::_Destroy_aux<false>::__destroy<std::pair<QString,QString>*>(b,__last);
  ppVar1 = (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
           super_QArrayDataPointer<std::pair<QString,_QString>_>.ptr;
  lVar2 = (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
          super_QArrayDataPointer<std::pair<QString,_QString>_>.size;
  ppVar3 = ppVar1 + lVar2;
  if (__last == ppVar3 || ppVar1 != b) {
    if (__last != ppVar3) {
      memmove(b,__last,(long)ppVar3 - (long)__last);
      lVar2 = (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
              super_QArrayDataPointer<std::pair<QString,_QString>_>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
    super_QArrayDataPointer<std::pair<QString,_QString>_>.ptr = __last;
  }
  (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
  super_QArrayDataPointer<std::pair<QString,_QString>_>.size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }